

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall google::protobuf::compiler::Parser::Consume(Parser *this,char *text,char *error)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  bVar2 = TryConsume(this,text);
  if (!bVar2) {
    std::__cxx11::string::string((string *)local_38,error,&local_39);
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_38);
    }
    this->had_errors_ = true;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return bVar2;
}

Assistant:

bool Parser::Consume(const char* text, const char* error) {
  if (TryConsume(text)) {
    return true;
  } else {
    AddError(error);
    return false;
  }
}